

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O0

bool __thiscall ArmParser::parseImmediate(ArmParser *this,Parser *parser,Expression *dest)

{
  bool bVar1;
  Tokenizer *pTVar2;
  Expression local_2d0;
  char local_2b8 [8];
  char local_2b0 [8];
  char local_2a8 [8];
  char local_2a0 [8];
  undefined4 local_298;
  undefined1 local_288 [8];
  ArmOpcodeVariables tempVars;
  TokenizerPosition pos;
  Expression *dest_local;
  Parser *parser_local;
  ArmParser *this_local;
  
  pTVar2 = Parser::getTokenizer(parser);
  tempVars.RlistStr._56_8_ = Tokenizer::getPosition(pTVar2);
  ArmOpcodeVariables::ArmOpcodeVariables((ArmOpcodeVariables *)local_288);
  bVar1 = parsePsrTransfer(this,parser,(ArmOpcodeVariables *)local_288,false);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    pTVar2 = Parser::getTokenizer(parser);
    local_2a0[0] = tempVars.RlistStr[0x38];
    local_2a0[1] = tempVars.RlistStr[0x39];
    local_2a0[2] = tempVars.RlistStr[0x3a];
    local_2a0[3] = tempVars.RlistStr[0x3b];
    local_2a0[4] = tempVars.RlistStr[0x3c];
    local_2a0[5] = tempVars.RlistStr[0x3d];
    local_2a0[6] = tempVars.RlistStr[0x3e];
    local_2a0[7] = tempVars.RlistStr[0x3f];
    Tokenizer::setPosition(pTVar2,(TokenizerPosition)tempVars.RlistStr._56_8_);
    bVar1 = parseRegister(this,parser,(ArmRegisterValue *)&tempVars.rm.num,0xf);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      pTVar2 = Parser::getTokenizer(parser);
      local_2a8[0] = tempVars.RlistStr[0x38];
      local_2a8[1] = tempVars.RlistStr[0x39];
      local_2a8[2] = tempVars.RlistStr[0x3a];
      local_2a8[3] = tempVars.RlistStr[0x3b];
      local_2a8[4] = tempVars.RlistStr[0x3c];
      local_2a8[5] = tempVars.RlistStr[0x3d];
      local_2a8[6] = tempVars.RlistStr[0x3e];
      local_2a8[7] = tempVars.RlistStr[0x3f];
      Tokenizer::setPosition(pTVar2,(TokenizerPosition)tempVars.RlistStr._56_8_);
      bVar1 = parseCopNumber(this,parser,(ArmRegisterValue *)&tempVars.rm.num);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        pTVar2 = Parser::getTokenizer(parser);
        local_2b0[0] = tempVars.RlistStr[0x38];
        local_2b0[1] = tempVars.RlistStr[0x39];
        local_2b0[2] = tempVars.RlistStr[0x3a];
        local_2b0[3] = tempVars.RlistStr[0x3b];
        local_2b0[4] = tempVars.RlistStr[0x3c];
        local_2b0[5] = tempVars.RlistStr[0x3d];
        local_2b0[6] = tempVars.RlistStr[0x3e];
        local_2b0[7] = tempVars.RlistStr[0x3f];
        Tokenizer::setPosition(pTVar2,(TokenizerPosition)tempVars.RlistStr._56_8_);
        bVar1 = parseCopRegister(this,parser,(ArmRegisterValue *)&tempVars.rm.num);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          pTVar2 = Parser::getTokenizer(parser);
          local_2b8[0] = tempVars.RlistStr[0x38];
          local_2b8[1] = tempVars.RlistStr[0x39];
          local_2b8[2] = tempVars.RlistStr[0x3a];
          local_2b8[3] = tempVars.RlistStr[0x3b];
          local_2b8[4] = tempVars.RlistStr[0x3c];
          local_2b8[5] = tempVars.RlistStr[0x3d];
          local_2b8[6] = tempVars.RlistStr[0x3e];
          local_2b8[7] = tempVars.RlistStr[0x3f];
          Tokenizer::setPosition(pTVar2,(TokenizerPosition)tempVars.RlistStr._56_8_);
          Parser::parseExpression(&local_2d0,parser);
          Expression::operator=(dest,&local_2d0);
          Expression::~Expression(&local_2d0);
          this_local._7_1_ = Expression::isLoaded(dest);
        }
      }
    }
  }
  local_298 = 1;
  ArmOpcodeVariables::~ArmOpcodeVariables((ArmOpcodeVariables *)local_288);
  return this_local._7_1_;
}

Assistant:

bool ArmParser::parseImmediate(Parser& parser, Expression& dest)
{
	TokenizerPosition pos = parser.getTokenizer()->getPosition();

	// check if it really is an immediate
	ArmOpcodeVariables tempVars;
	if (parsePsrTransfer(parser,tempVars,false))
		return false;

	parser.getTokenizer()->setPosition(pos);
	if (parseRegister(parser,tempVars.rd))
		return false;
	
	parser.getTokenizer()->setPosition(pos);
	if (parseCopNumber(parser,tempVars.rd))
		return false;
	
	parser.getTokenizer()->setPosition(pos);
	if (parseCopRegister(parser,tempVars.rd))
		return false;
	
	parser.getTokenizer()->setPosition(pos);
	dest = parser.parseExpression();
	return dest.isLoaded();
}